

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4402ef::FloatExpr<double>::printLeft(FloatExpr<double> *this,OutputStream *s)

{
  undefined1 uVar1;
  char *pcVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  long lVar6;
  char cVar7;
  size_t N;
  anon_union_8_2_325080ff anon_var_0;
  char num [32];
  undefined1 local_41;
  undefined4 local_40 [2];
  char local_38 [40];
  
  pcVar2 = (this->Contents).First;
  if ((char *)0x10 < (this->Contents).Last + (1 - (long)pcVar2)) {
    lVar6 = 0;
    puVar5 = (undefined4 *)&local_41;
    do {
      puVar4 = puVar5;
      cVar7 = -0x57;
      if ((int)pcVar2[lVar6 + 1] - 0x30U < 10) {
        cVar7 = -0x30;
      }
      *(char *)((long)puVar4 + 1) =
           ((9 < (int)pcVar2[lVar6] - 0x30U) * '\t' + pcVar2[lVar6]) * '\x10' +
           cVar7 + pcVar2[lVar6 + 1];
      lVar6 = lVar6 + 2;
      puVar5 = (undefined4 *)((long)puVar4 + 1);
    } while (lVar6 != 0x10);
    puVar5 = local_40;
    if (puVar5 < (undefined4 *)((long)puVar4 + 1)) {
      lVar6 = -1;
      do {
        uVar1 = *(undefined1 *)puVar5;
        *(undefined1 *)puVar5 = *(undefined1 *)((long)puVar4 + lVar6 + 2);
        *(undefined1 *)((long)puVar4 + lVar6 + 2) = uVar1;
        lVar6 = lVar6 + -1;
        puVar5 = (undefined4 *)((long)puVar5 + 1);
      } while (lVar6 != -5);
    }
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0x18] = '\0';
    local_38[0x19] = '\0';
    local_38[0x1a] = '\0';
    local_38[0x1b] = '\0';
    local_38[0x1c] = '\0';
    local_38[0x1d] = '\0';
    local_38[0x1e] = '\0';
    local_38[0x1f] = '\0';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    iVar3 = snprintf(local_38,0x20,"%a",local_40[0]);
    if (iVar3 != 0) {
      N = (size_t)iVar3;
      OutputStream::grow(s,N);
      memcpy(s->Buffer + s->CurrentPosition,local_38,N);
      s->CurrentPosition = s->CurrentPosition + N;
    }
  }
  return;
}

Assistant:

const char *end() const { return Last; }